

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O0

void RelPath(tchar_t *Rel,int RelLen,tchar_t *Path,tchar_t *Base)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  tchar_t *b;
  tchar_t *a;
  tchar_t *p;
  bool_t HasHost;
  size_t n;
  tchar_t *Base_local;
  tchar_t *Path_local;
  tchar_t *ptStack_10;
  int RelLen_local;
  tchar_t *Rel_local;
  
  n = (size_t)Base;
  Base_local = Path;
  Path_local._4_4_ = RelLen;
  ptStack_10 = Rel;
  a = GetProtocol(Base,(tchar_t *)0x0,0,(bool_t *)&p);
  if (a != (tchar_t *)n) {
    if (p != (tchar_t *)0x0) {
      b = strchr(a,0x5c);
      pcVar2 = strchr(a,0x2f);
      if ((b == (char *)0x0) || ((pcVar2 != (char *)0x0 && (pcVar2 < b)))) {
        b = pcVar2;
      }
      if (b == (tchar_t *)0x0) {
        sVar4 = strlen(a);
        a = a + sVar4;
      }
      else {
        a = b;
      }
    }
    uVar3 = (long)a - n;
    HasHost = uVar3;
    if ((((uVar3 != 0) && (sVar4 = strlen(Base_local), uVar3 < sVar4)) &&
        ((Base_local[HasHost] == '\\' || (Base_local[HasHost] == '/')))) &&
       (iVar1 = tcsnicmp(Base_local,(tchar_t *)n,HasHost), iVar1 == 0)) {
      n = HasHost + n;
      Base_local = Base_local + HasHost;
    }
  }
  sVar4 = strlen((char *)n);
  HasHost = sVar4;
  if (((sVar4 != 0) && (sVar5 = strlen(Base_local), sVar4 < sVar5)) &&
     (((Base_local[HasHost] == '\\' || (Base_local[HasHost] == '/')) &&
      (iVar1 = tcsnicmp(Base_local,(tchar_t *)n,HasHost), iVar1 == 0)))) {
    Base_local = Base_local + HasHost + 1;
  }
  tcscpy_s(ptStack_10,(long)Path_local._4_4_,Base_local);
  return;
}

Assistant:

void RelPath(tchar_t* Rel, int RelLen, const tchar_t* Path, const tchar_t* Base)
{
    size_t n;
    bool_t HasHost;
    const tchar_t* p = GetProtocol(Base,NULL,0,&HasHost);
    if (p != Base)
    {
        if (HasHost)
        {
            // include host name too
            tchar_t *a,*b;
            a = tcschr(p,'\\');
            b = tcschr(p,'/');
            if (!a || (b && b<a))
                a=b;
            if (a)
                p=a;
            else
                p+=tcslen(p);
        }

        // check if mime and host is the same
        n = p-Base;
        if (n>0 && n<tcslen(Path) && (Path[n]=='\\' || Path[n]=='/') && tcsnicmp(Path,Base,n)==0)
        {
            Base += n;
            Path += n;
        }
    }

    n = tcslen(Base);
    if (n>0 && n<tcslen(Path) && (Path[n]=='\\' || Path[n]=='/') && tcsnicmp(Path,Base,n)==0)
        Path += n+1;

    tcscpy_s(Rel,RelLen,Path);
}